

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_avx2.c
# Opt level: O0

void fdct16_avx2(__m256i *in,__m256i *out,int8_t bit,int col_num,int outstride)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  uint uVar95;
  int32_t *piVar96;
  undefined8 *puVar97;
  int in_ECX;
  char in_DL;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  int col;
  __m256i x;
  __m256i v [16];
  __m256i u [16];
  __m256i rnding;
  __m256i cospi52;
  __m256i cospi12;
  __m256i cospi20;
  __m256i cospi44;
  __m256i cospi36;
  __m256i cospi28;
  __m256i cospi4;
  __m256i cospi60;
  __m256i cospi40;
  __m256i cospi24;
  __m256i cospi8;
  __m256i cospi56;
  __m256i cospim16;
  __m256i cospim48;
  __m256i cospi16;
  __m256i cospi48;
  __m256i cospim32;
  __m256i cospi32;
  int32_t *cospi;
  int local_3804;
  undefined8 local_37e0;
  undefined8 uStack_37d8;
  undefined8 uStack_37c8;
  undefined8 local_37c0;
  undefined8 uStack_37b8;
  undefined8 uStack_37a8;
  undefined8 local_37a0;
  undefined8 uStack_3798;
  undefined8 uStack_3788;
  undefined8 local_3780;
  undefined8 uStack_3778;
  undefined8 uStack_3768;
  undefined8 local_3760;
  undefined8 uStack_3758;
  undefined8 uStack_3750;
  undefined8 local_3740;
  undefined8 uStack_3738;
  undefined8 uStack_3730;
  undefined8 local_3720;
  undefined8 uStack_3718;
  undefined8 uStack_3710;
  undefined8 local_3700;
  undefined8 uStack_36f8;
  undefined8 uStack_36f0;
  undefined8 local_36e0;
  undefined8 uStack_36d8;
  undefined8 uStack_36d0;
  undefined8 uStack_36c8;
  undefined8 local_36c0;
  undefined8 uStack_36b8;
  undefined8 uStack_36b0;
  undefined8 uStack_36a8;
  undefined8 local_36a0;
  undefined8 uStack_3698;
  undefined8 uStack_3690;
  undefined8 uStack_3688;
  undefined8 local_3680;
  undefined8 uStack_3678;
  undefined8 uStack_3670;
  undefined8 uStack_3668;
  undefined8 local_3660;
  undefined8 uStack_3658;
  undefined8 uStack_3650;
  undefined8 uStack_3648;
  undefined8 local_3640;
  undefined8 uStack_3638;
  undefined8 uStack_3630;
  undefined8 uStack_3628;
  undefined8 local_3620;
  undefined8 uStack_3618;
  undefined8 uStack_3610;
  undefined8 uStack_3608;
  undefined8 local_3600;
  undefined8 uStack_35f8;
  undefined8 uStack_35f0;
  undefined8 uStack_35e8;
  undefined8 uStack_35d0;
  undefined8 uStack_35b0;
  undefined8 uStack_3590;
  undefined8 uStack_3570;
  undefined8 uStack_3548;
  undefined8 uStack_3528;
  undefined8 uStack_3508;
  undefined8 uStack_34e8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  piVar96 = cospi_arr((int)in_DL);
  uVar95 = piVar96[0x20];
  auVar1 = vpinsrd_avx(ZEXT416(uVar95),uVar95,1);
  auVar1 = vpinsrd_avx(auVar1,uVar95,2);
  auVar1 = vpinsrd_avx(auVar1,uVar95,3);
  auVar2 = vpinsrd_avx(ZEXT416(uVar95),uVar95,1);
  auVar2 = vpinsrd_avx(auVar2,uVar95,2);
  auVar2 = vpinsrd_avx(auVar2,uVar95,3);
  uStack_4f0 = auVar2._0_8_;
  uStack_4e8 = auVar2._8_8_;
  uVar95 = -piVar96[0x20];
  auVar2 = vpinsrd_avx(ZEXT416(uVar95),uVar95,1);
  auVar2 = vpinsrd_avx(auVar2,uVar95,2);
  auVar2 = vpinsrd_avx(auVar2,uVar95,3);
  auVar3 = vpinsrd_avx(ZEXT416(uVar95),uVar95,1);
  auVar3 = vpinsrd_avx(auVar3,uVar95,2);
  auVar3 = vpinsrd_avx(auVar3,uVar95,3);
  uStack_4b0 = auVar3._0_8_;
  uStack_4a8 = auVar3._8_8_;
  uVar95 = piVar96[0x30];
  auVar3 = vpinsrd_avx(ZEXT416(uVar95),uVar95,1);
  auVar3 = vpinsrd_avx(auVar3,uVar95,2);
  auVar3 = vpinsrd_avx(auVar3,uVar95,3);
  auVar4 = vpinsrd_avx(ZEXT416(uVar95),uVar95,1);
  auVar4 = vpinsrd_avx(auVar4,uVar95,2);
  auVar4 = vpinsrd_avx(auVar4,uVar95,3);
  uStack_470 = auVar4._0_8_;
  uStack_468 = auVar4._8_8_;
  uVar95 = piVar96[0x10];
  auVar4 = vpinsrd_avx(ZEXT416(uVar95),uVar95,1);
  auVar4 = vpinsrd_avx(auVar4,uVar95,2);
  auVar4 = vpinsrd_avx(auVar4,uVar95,3);
  auVar5 = vpinsrd_avx(ZEXT416(uVar95),uVar95,1);
  auVar5 = vpinsrd_avx(auVar5,uVar95,2);
  auVar5 = vpinsrd_avx(auVar5,uVar95,3);
  uStack_430 = auVar5._0_8_;
  uStack_428 = auVar5._8_8_;
  uVar95 = -piVar96[0x30];
  auVar5 = vpinsrd_avx(ZEXT416(uVar95),uVar95,1);
  auVar5 = vpinsrd_avx(auVar5,uVar95,2);
  auVar5 = vpinsrd_avx(auVar5,uVar95,3);
  auVar6 = vpinsrd_avx(ZEXT416(uVar95),uVar95,1);
  auVar6 = vpinsrd_avx(auVar6,uVar95,2);
  auVar6 = vpinsrd_avx(auVar6,uVar95,3);
  uStack_3f0 = auVar6._0_8_;
  uStack_3e8 = auVar6._8_8_;
  uVar95 = -piVar96[0x10];
  auVar6 = vpinsrd_avx(ZEXT416(uVar95),uVar95,1);
  auVar6 = vpinsrd_avx(auVar6,uVar95,2);
  auVar6 = vpinsrd_avx(auVar6,uVar95,3);
  auVar7 = vpinsrd_avx(ZEXT416(uVar95),uVar95,1);
  auVar7 = vpinsrd_avx(auVar7,uVar95,2);
  auVar7 = vpinsrd_avx(auVar7,uVar95,3);
  uStack_3b0 = auVar7._0_8_;
  uStack_3a8 = auVar7._8_8_;
  uVar95 = piVar96[0x38];
  auVar7 = vpinsrd_avx(ZEXT416(uVar95),uVar95,1);
  auVar7 = vpinsrd_avx(auVar7,uVar95,2);
  auVar7 = vpinsrd_avx(auVar7,uVar95,3);
  auVar8 = vpinsrd_avx(ZEXT416(uVar95),uVar95,1);
  auVar8 = vpinsrd_avx(auVar8,uVar95,2);
  auVar8 = vpinsrd_avx(auVar8,uVar95,3);
  uStack_370 = auVar8._0_8_;
  uStack_368 = auVar8._8_8_;
  uVar95 = piVar96[8];
  auVar8 = vpinsrd_avx(ZEXT416(uVar95),uVar95,1);
  auVar8 = vpinsrd_avx(auVar8,uVar95,2);
  auVar8 = vpinsrd_avx(auVar8,uVar95,3);
  auVar9 = vpinsrd_avx(ZEXT416(uVar95),uVar95,1);
  auVar9 = vpinsrd_avx(auVar9,uVar95,2);
  auVar9 = vpinsrd_avx(auVar9,uVar95,3);
  uStack_330 = auVar9._0_8_;
  uStack_328 = auVar9._8_8_;
  uVar95 = piVar96[0x18];
  auVar9 = vpinsrd_avx(ZEXT416(uVar95),uVar95,1);
  auVar9 = vpinsrd_avx(auVar9,uVar95,2);
  auVar9 = vpinsrd_avx(auVar9,uVar95,3);
  auVar10 = vpinsrd_avx(ZEXT416(uVar95),uVar95,1);
  auVar10 = vpinsrd_avx(auVar10,uVar95,2);
  auVar10 = vpinsrd_avx(auVar10,uVar95,3);
  uStack_2f0 = auVar10._0_8_;
  uStack_2e8 = auVar10._8_8_;
  uVar95 = piVar96[0x28];
  auVar10 = vpinsrd_avx(ZEXT416(uVar95),uVar95,1);
  auVar10 = vpinsrd_avx(auVar10,uVar95,2);
  auVar10 = vpinsrd_avx(auVar10,uVar95,3);
  auVar11 = vpinsrd_avx(ZEXT416(uVar95),uVar95,1);
  auVar11 = vpinsrd_avx(auVar11,uVar95,2);
  auVar11 = vpinsrd_avx(auVar11,uVar95,3);
  uStack_2b0 = auVar11._0_8_;
  uStack_2a8 = auVar11._8_8_;
  uVar95 = piVar96[0x3c];
  auVar11 = vpinsrd_avx(ZEXT416(uVar95),uVar95,1);
  auVar11 = vpinsrd_avx(auVar11,uVar95,2);
  auVar11 = vpinsrd_avx(auVar11,uVar95,3);
  auVar12 = vpinsrd_avx(ZEXT416(uVar95),uVar95,1);
  auVar12 = vpinsrd_avx(auVar12,uVar95,2);
  auVar12 = vpinsrd_avx(auVar12,uVar95,3);
  uStack_270 = auVar12._0_8_;
  uStack_268 = auVar12._8_8_;
  uVar95 = piVar96[4];
  auVar12 = vpinsrd_avx(ZEXT416(uVar95),uVar95,1);
  auVar12 = vpinsrd_avx(auVar12,uVar95,2);
  auVar12 = vpinsrd_avx(auVar12,uVar95,3);
  auVar13 = vpinsrd_avx(ZEXT416(uVar95),uVar95,1);
  auVar13 = vpinsrd_avx(auVar13,uVar95,2);
  auVar13 = vpinsrd_avx(auVar13,uVar95,3);
  uStack_230 = auVar13._0_8_;
  uStack_228 = auVar13._8_8_;
  uVar95 = piVar96[0x1c];
  auVar13 = vpinsrd_avx(ZEXT416(uVar95),uVar95,1);
  auVar13 = vpinsrd_avx(auVar13,uVar95,2);
  auVar13 = vpinsrd_avx(auVar13,uVar95,3);
  auVar14 = vpinsrd_avx(ZEXT416(uVar95),uVar95,1);
  auVar14 = vpinsrd_avx(auVar14,uVar95,2);
  auVar14 = vpinsrd_avx(auVar14,uVar95,3);
  uStack_1f0 = auVar14._0_8_;
  uStack_1e8 = auVar14._8_8_;
  uVar95 = piVar96[0x24];
  auVar14 = vpinsrd_avx(ZEXT416(uVar95),uVar95,1);
  auVar14 = vpinsrd_avx(auVar14,uVar95,2);
  auVar14 = vpinsrd_avx(auVar14,uVar95,3);
  auVar15 = vpinsrd_avx(ZEXT416(uVar95),uVar95,1);
  auVar15 = vpinsrd_avx(auVar15,uVar95,2);
  auVar15 = vpinsrd_avx(auVar15,uVar95,3);
  uStack_1b0 = auVar15._0_8_;
  uStack_1a8 = auVar15._8_8_;
  uVar95 = piVar96[0x2c];
  auVar15 = vpinsrd_avx(ZEXT416(uVar95),uVar95,1);
  auVar15 = vpinsrd_avx(auVar15,uVar95,2);
  auVar15 = vpinsrd_avx(auVar15,uVar95,3);
  auVar16 = vpinsrd_avx(ZEXT416(uVar95),uVar95,1);
  auVar16 = vpinsrd_avx(auVar16,uVar95,2);
  auVar16 = vpinsrd_avx(auVar16,uVar95,3);
  uStack_170 = auVar16._0_8_;
  uStack_168 = auVar16._8_8_;
  uVar95 = piVar96[0x14];
  auVar16 = vpinsrd_avx(ZEXT416(uVar95),uVar95,1);
  auVar16 = vpinsrd_avx(auVar16,uVar95,2);
  auVar16 = vpinsrd_avx(auVar16,uVar95,3);
  auVar17 = vpinsrd_avx(ZEXT416(uVar95),uVar95,1);
  auVar17 = vpinsrd_avx(auVar17,uVar95,2);
  auVar17 = vpinsrd_avx(auVar17,uVar95,3);
  uStack_130 = auVar17._0_8_;
  uStack_128 = auVar17._8_8_;
  uVar95 = piVar96[0xc];
  auVar17 = vpinsrd_avx(ZEXT416(uVar95),uVar95,1);
  auVar17 = vpinsrd_avx(auVar17,uVar95,2);
  auVar17 = vpinsrd_avx(auVar17,uVar95,3);
  auVar18 = vpinsrd_avx(ZEXT416(uVar95),uVar95,1);
  auVar18 = vpinsrd_avx(auVar18,uVar95,2);
  auVar18 = vpinsrd_avx(auVar18,uVar95,3);
  uStack_f0 = auVar18._0_8_;
  uStack_e8 = auVar18._8_8_;
  uVar95 = piVar96[0x34];
  auVar18 = vpinsrd_avx(ZEXT416(uVar95),uVar95,1);
  auVar18 = vpinsrd_avx(auVar18,uVar95,2);
  auVar18 = vpinsrd_avx(auVar18,uVar95,3);
  auVar99 = vpinsrd_avx(ZEXT416(uVar95),uVar95,1);
  auVar99 = vpinsrd_avx(auVar99,uVar95,2);
  auVar99 = vpinsrd_avx(auVar99,uVar95,3);
  uStack_b0 = auVar99._0_8_;
  uStack_a8 = auVar99._8_8_;
  uVar95 = 1 << (in_DL - 1U & 0x1f);
  auVar99 = vpinsrd_avx(ZEXT416(uVar95),uVar95,1);
  auVar99 = vpinsrd_avx(auVar99,uVar95,2);
  auVar99 = vpinsrd_avx(auVar99,uVar95,3);
  auVar98 = vpinsrd_avx(ZEXT416(uVar95),uVar95,1);
  auVar98 = vpinsrd_avx(auVar98,uVar95,2);
  auVar98 = vpinsrd_avx(auVar98,uVar95,3);
  auVar98 = ZEXT116(0) * auVar99 + ZEXT116(1) * auVar98;
  auVar99 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar99;
  uStack_70 = auVar99._0_8_;
  uStack_68 = auVar99._8_8_;
  for (local_3804 = 0; local_3804 < in_ECX; local_3804 = local_3804 + 1) {
    auVar19 = vpaddd_avx2(*(undefined1 (*) [32])(in_RDI + (long)local_3804 * 0x20),
                          *(undefined1 (*) [32])(in_RDI + (long)(in_ECX * 0xf + local_3804) * 0x20))
    ;
    auVar28 = vpsubd_avx2(*(undefined1 (*) [32])(in_RDI + (long)local_3804 * 0x20),
                          *(undefined1 (*) [32])(in_RDI + (long)(in_ECX * 0xf + local_3804) * 0x20))
    ;
    auVar20 = vpaddd_avx2(*(undefined1 (*) [32])(in_RDI + (long)(in_ECX + local_3804) * 0x20),
                          *(undefined1 (*) [32])(in_RDI + (long)(in_ECX * 0xe + local_3804) * 0x20))
    ;
    auVar29 = vpsubd_avx2(*(undefined1 (*) [32])(in_RDI + (long)(in_ECX + local_3804) * 0x20),
                          *(undefined1 (*) [32])(in_RDI + (long)(in_ECX * 0xe + local_3804) * 0x20))
    ;
    auVar21 = vpaddd_avx2(*(undefined1 (*) [32])(in_RDI + (long)(in_ECX * 2 + local_3804) * 0x20),
                          *(undefined1 (*) [32])(in_RDI + (long)(in_ECX * 0xd + local_3804) * 0x20))
    ;
    auVar30 = vpsubd_avx2(*(undefined1 (*) [32])(in_RDI + (long)(in_ECX * 2 + local_3804) * 0x20),
                          *(undefined1 (*) [32])(in_RDI + (long)(in_ECX * 0xd + local_3804) * 0x20))
    ;
    auVar22 = vpaddd_avx2(*(undefined1 (*) [32])(in_RDI + (long)(in_ECX * 3 + local_3804) * 0x20),
                          *(undefined1 (*) [32])(in_RDI + (long)(in_ECX * 0xc + local_3804) * 0x20))
    ;
    auVar31 = vpsubd_avx2(*(undefined1 (*) [32])(in_RDI + (long)(in_ECX * 3 + local_3804) * 0x20),
                          *(undefined1 (*) [32])(in_RDI + (long)(in_ECX * 0xc + local_3804) * 0x20))
    ;
    auVar23 = vpaddd_avx2(*(undefined1 (*) [32])(in_RDI + (long)(in_ECX * 4 + local_3804) * 0x20),
                          *(undefined1 (*) [32])(in_RDI + (long)(in_ECX * 0xb + local_3804) * 0x20))
    ;
    auVar32 = vpsubd_avx2(*(undefined1 (*) [32])(in_RDI + (long)(in_ECX * 4 + local_3804) * 0x20),
                          *(undefined1 (*) [32])(in_RDI + (long)(in_ECX * 0xb + local_3804) * 0x20))
    ;
    auVar24 = vpaddd_avx2(*(undefined1 (*) [32])(in_RDI + (long)(in_ECX * 5 + local_3804) * 0x20),
                          *(undefined1 (*) [32])(in_RDI + (long)(in_ECX * 10 + local_3804) * 0x20));
    auVar33 = vpsubd_avx2(*(undefined1 (*) [32])(in_RDI + (long)(in_ECX * 5 + local_3804) * 0x20),
                          *(undefined1 (*) [32])(in_RDI + (long)(in_ECX * 10 + local_3804) * 0x20));
    auVar25 = vpaddd_avx2(*(undefined1 (*) [32])(in_RDI + (long)(in_ECX * 6 + local_3804) * 0x20),
                          *(undefined1 (*) [32])(in_RDI + (long)(in_ECX * 9 + local_3804) * 0x20));
    auVar34 = vpsubd_avx2(*(undefined1 (*) [32])(in_RDI + (long)(in_ECX * 6 + local_3804) * 0x20),
                          *(undefined1 (*) [32])(in_RDI + (long)(in_ECX * 9 + local_3804) * 0x20));
    auVar26 = vpaddd_avx2(*(undefined1 (*) [32])(in_RDI + (long)(in_ECX * 7 + local_3804) * 0x20),
                          *(undefined1 (*) [32])(in_RDI + (long)(in_ECX * 8 + local_3804) * 0x20));
    auVar35 = vpsubd_avx2(*(undefined1 (*) [32])(in_RDI + (long)(in_ECX * 7 + local_3804) * 0x20),
                          *(undefined1 (*) [32])(in_RDI + (long)(in_ECX * 8 + local_3804) * 0x20));
    auVar27 = vpaddd_avx2(auVar19,auVar26);
    auVar36 = vpsubd_avx2(auVar19,auVar26);
    auVar19 = vpaddd_avx2(auVar20,auVar25);
    auVar37 = vpsubd_avx2(auVar20,auVar25);
    auVar20 = vpaddd_avx2(auVar21,auVar24);
    auVar38 = vpsubd_avx2(auVar21,auVar24);
    auVar21 = vpaddd_avx2(auVar22,auVar23);
    auVar39 = vpsubd_avx2(auVar22,auVar23);
    auVar94._16_8_ = uStack_4b0;
    auVar94._0_16_ = auVar2;
    auVar94._24_8_ = uStack_4a8;
    auVar22 = vpmulld_avx2(auVar33,auVar94);
    auVar93._16_8_ = uStack_4f0;
    auVar93._0_16_ = auVar1;
    auVar93._24_8_ = uStack_4e8;
    auVar23 = vpmulld_avx2(auVar30,auVar93);
    auVar22 = vpaddd_avx2(auVar22,auVar23);
    auVar46._16_8_ = uStack_70;
    auVar46._0_16_ = auVar98;
    auVar46._24_8_ = uStack_68;
    auVar22 = vpaddd_avx2(auVar22,auVar46);
    auVar24 = vpsrad_avx2(auVar22,ZEXT416((uint)(int)in_DL));
    auVar92._16_8_ = uStack_4f0;
    auVar92._0_16_ = auVar1;
    auVar92._24_8_ = uStack_4e8;
    auVar22 = vpmulld_avx2(auVar33,auVar92);
    auVar91._16_8_ = uStack_4b0;
    auVar91._0_16_ = auVar2;
    auVar91._24_8_ = uStack_4a8;
    auVar23 = vpmulld_avx2(auVar30,auVar91);
    auVar22 = vpsubd_avx2(auVar22,auVar23);
    auVar45._16_8_ = uStack_70;
    auVar45._0_16_ = auVar98;
    auVar45._24_8_ = uStack_68;
    auVar22 = vpaddd_avx2(auVar22,auVar45);
    auVar25 = vpsrad_avx2(auVar22,ZEXT416((uint)(int)in_DL));
    auVar90._16_8_ = uStack_4b0;
    auVar90._0_16_ = auVar2;
    auVar90._24_8_ = uStack_4a8;
    auVar22 = vpmulld_avx2(auVar32,auVar90);
    auVar89._16_8_ = uStack_4f0;
    auVar89._0_16_ = auVar1;
    auVar89._24_8_ = uStack_4e8;
    auVar23 = vpmulld_avx2(auVar31,auVar89);
    auVar22 = vpaddd_avx2(auVar22,auVar23);
    auVar44._16_8_ = uStack_70;
    auVar44._0_16_ = auVar98;
    auVar44._24_8_ = uStack_68;
    auVar22 = vpaddd_avx2(auVar22,auVar44);
    auVar26 = vpsrad_avx2(auVar22,ZEXT416((uint)(int)in_DL));
    auVar88._16_8_ = uStack_4f0;
    auVar88._0_16_ = auVar1;
    auVar88._24_8_ = uStack_4e8;
    auVar22 = vpmulld_avx2(auVar32,auVar88);
    auVar87._16_8_ = uStack_4b0;
    auVar87._0_16_ = auVar2;
    auVar87._24_8_ = uStack_4a8;
    auVar23 = vpmulld_avx2(auVar31,auVar87);
    auVar22 = vpsubd_avx2(auVar22,auVar23);
    auVar23._16_8_ = uStack_70;
    auVar23._0_16_ = auVar98;
    auVar23._24_8_ = uStack_68;
    auVar22 = vpaddd_avx2(auVar22,auVar23);
    auVar23 = vpsrad_avx2(auVar22,ZEXT416((uint)(int)in_DL));
    auVar22 = vpaddd_avx2(auVar27,auVar21);
    auVar32 = vpsubd_avx2(auVar27,auVar21);
    auVar21 = vpaddd_avx2(auVar19,auVar20);
    auVar33 = vpsubd_avx2(auVar19,auVar20);
    auVar86._16_8_ = uStack_4b0;
    auVar86._0_16_ = auVar2;
    auVar86._24_8_ = uStack_4a8;
    auVar19 = vpmulld_avx2(auVar38,auVar86);
    auVar85._16_8_ = uStack_4f0;
    auVar85._0_16_ = auVar1;
    auVar85._24_8_ = uStack_4e8;
    auVar20 = vpmulld_avx2(auVar37,auVar85);
    auVar19 = vpaddd_avx2(auVar19,auVar20);
    auVar40._16_8_ = uStack_70;
    auVar40._0_16_ = auVar98;
    auVar40._24_8_ = uStack_68;
    auVar19 = vpaddd_avx2(auVar19,auVar40);
    auVar27 = vpsrad_avx2(auVar19,ZEXT416((uint)(int)in_DL));
    auVar19._16_8_ = uStack_4f0;
    auVar19._0_16_ = auVar1;
    auVar19._24_8_ = uStack_4e8;
    auVar19 = vpmulld_avx2(auVar38,auVar19);
    auVar84._16_8_ = uStack_4b0;
    auVar84._0_16_ = auVar2;
    auVar84._24_8_ = uStack_4a8;
    auVar20 = vpmulld_avx2(auVar37,auVar84);
    auVar19 = vpsubd_avx2(auVar19,auVar20);
    auVar38._16_8_ = uStack_70;
    auVar38._0_16_ = auVar98;
    auVar38._24_8_ = uStack_68;
    auVar19 = vpaddd_avx2(auVar19,auVar38);
    auVar30 = vpsrad_avx2(auVar19,ZEXT416((uint)(int)in_DL));
    auVar19 = vpaddd_avx2(auVar35,auVar26);
    auVar37 = vpsubd_avx2(auVar35,auVar26);
    auVar20 = vpaddd_avx2(auVar34,auVar24);
    auVar34 = vpsubd_avx2(auVar34,auVar24);
    auVar38 = vpsubd_avx2(auVar28,auVar23);
    auVar23 = vpaddd_avx2(auVar28,auVar23);
    auVar35 = vpsubd_avx2(auVar29,auVar25);
    auVar24 = vpaddd_avx2(auVar29,auVar25);
    auVar83._16_8_ = uStack_4f0;
    auVar83._0_16_ = auVar1;
    auVar83._24_8_ = uStack_4e8;
    auVar22 = vpmulld_avx2(auVar22,auVar83);
    auVar82._16_8_ = uStack_4f0;
    auVar82._0_16_ = auVar1;
    auVar82._24_8_ = uStack_4e8;
    auVar25 = vpmulld_avx2(auVar21,auVar82);
    auVar21 = vpaddd_avx2(auVar22,auVar25);
    auVar28._16_8_ = uStack_70;
    auVar28._0_16_ = auVar98;
    auVar28._24_8_ = uStack_68;
    auVar21 = vpaddd_avx2(auVar21,auVar28);
    auVar28 = vpsrad_avx2(auVar21,ZEXT416((uint)(int)in_DL));
    auVar21 = vpsubd_avx2(auVar22,auVar25);
    auVar29._16_8_ = uStack_70;
    auVar29._0_16_ = auVar98;
    auVar29._24_8_ = uStack_68;
    auVar21 = vpaddd_avx2(auVar21,auVar29);
    auVar29 = vpsrad_avx2(auVar21,ZEXT416((uint)(int)in_DL));
    auVar81._16_8_ = uStack_470;
    auVar81._0_16_ = auVar3;
    auVar81._24_8_ = uStack_468;
    auVar21 = vpmulld_avx2(auVar33,auVar81);
    auVar80._16_8_ = uStack_430;
    auVar80._0_16_ = auVar4;
    auVar80._24_8_ = uStack_428;
    auVar22 = vpmulld_avx2(auVar32,auVar80);
    auVar21 = vpaddd_avx2(auVar21,auVar22);
    auVar31._16_8_ = uStack_70;
    auVar31._0_16_ = auVar98;
    auVar31._24_8_ = uStack_68;
    auVar21 = vpaddd_avx2(auVar21,auVar31);
    auVar31 = vpsrad_avx2(auVar21,ZEXT416((uint)(int)in_DL));
    auVar79._16_8_ = uStack_430;
    auVar79._0_16_ = auVar4;
    auVar79._24_8_ = uStack_428;
    auVar21 = vpmulld_avx2(auVar33,auVar79);
    auVar78._16_8_ = uStack_470;
    auVar78._0_16_ = auVar3;
    auVar78._24_8_ = uStack_468;
    auVar22 = vpmulld_avx2(auVar32,auVar78);
    auVar21 = vpsubd_avx2(auVar22,auVar21);
    auVar32._16_8_ = uStack_70;
    auVar32._0_16_ = auVar98;
    auVar32._24_8_ = uStack_68;
    auVar21 = vpaddd_avx2(auVar21,auVar32);
    auVar32 = vpsrad_avx2(auVar21,ZEXT416((uint)(int)in_DL));
    auVar21 = vpaddd_avx2(auVar39,auVar27);
    auVar39 = vpsubd_avx2(auVar39,auVar27);
    auVar40 = vpsubd_avx2(auVar36,auVar30);
    auVar22 = vpaddd_avx2(auVar36,auVar30);
    auVar77._16_8_ = uStack_3b0;
    auVar77._0_16_ = auVar6;
    auVar77._24_8_ = uStack_3a8;
    auVar25 = vpmulld_avx2(auVar20,auVar77);
    auVar76._16_8_ = uStack_470;
    auVar76._0_16_ = auVar3;
    auVar76._24_8_ = uStack_468;
    auVar26 = vpmulld_avx2(auVar24,auVar76);
    auVar25 = vpaddd_avx2(auVar25,auVar26);
    auVar43._16_8_ = uStack_70;
    auVar43._0_16_ = auVar98;
    auVar43._24_8_ = uStack_68;
    auVar25 = vpaddd_avx2(auVar25,auVar43);
    auVar25 = vpsrad_avx2(auVar25,ZEXT416((uint)(int)in_DL));
    auVar75._16_8_ = uStack_470;
    auVar75._0_16_ = auVar3;
    auVar75._24_8_ = uStack_468;
    auVar20 = vpmulld_avx2(auVar20,auVar75);
    auVar74._16_8_ = uStack_3b0;
    auVar74._0_16_ = auVar6;
    auVar74._24_8_ = uStack_3a8;
    auVar24 = vpmulld_avx2(auVar24,auVar74);
    auVar20 = vpsubd_avx2(auVar20,auVar24);
    auVar42._16_8_ = uStack_70;
    auVar42._0_16_ = auVar98;
    auVar42._24_8_ = uStack_68;
    auVar20 = vpaddd_avx2(auVar20,auVar42);
    auVar26 = vpsrad_avx2(auVar20,ZEXT416((uint)(int)in_DL));
    auVar73._16_8_ = uStack_3f0;
    auVar73._0_16_ = auVar5;
    auVar73._24_8_ = uStack_3e8;
    auVar20 = vpmulld_avx2(auVar34,auVar73);
    auVar72._16_8_ = uStack_3b0;
    auVar72._0_16_ = auVar6;
    auVar72._24_8_ = uStack_3a8;
    auVar24 = vpmulld_avx2(auVar35,auVar72);
    auVar20 = vpaddd_avx2(auVar20,auVar24);
    auVar41._16_8_ = uStack_70;
    auVar41._0_16_ = auVar98;
    auVar41._24_8_ = uStack_68;
    auVar20 = vpaddd_avx2(auVar20,auVar41);
    auVar27 = vpsrad_avx2(auVar20,ZEXT416((uint)(int)in_DL));
    auVar71._16_8_ = uStack_3b0;
    auVar71._0_16_ = auVar6;
    auVar71._24_8_ = uStack_3a8;
    auVar20 = vpmulld_avx2(auVar34,auVar71);
    auVar70._16_8_ = uStack_3f0;
    auVar70._0_16_ = auVar5;
    auVar70._24_8_ = uStack_3e8;
    auVar24 = vpmulld_avx2(auVar35,auVar70);
    auVar20 = vpsubd_avx2(auVar20,auVar24);
    auVar36._16_8_ = uStack_70;
    auVar36._0_16_ = auVar98;
    auVar36._24_8_ = uStack_68;
    auVar20 = vpaddd_avx2(auVar20,auVar36);
    auVar30 = vpsrad_avx2(auVar20,ZEXT416((uint)(int)in_DL));
    uStack_37c8 = auVar28._24_8_;
    uStack_37a8 = auVar29._24_8_;
    uStack_3788 = auVar31._24_8_;
    uStack_3768 = auVar32._24_8_;
    auVar69._16_8_ = uStack_370;
    auVar69._0_16_ = auVar7;
    auVar69._24_8_ = uStack_368;
    auVar20 = vpmulld_avx2(auVar21,auVar69);
    auVar68._16_8_ = uStack_330;
    auVar68._0_16_ = auVar8;
    auVar68._24_8_ = uStack_328;
    auVar24 = vpmulld_avx2(auVar22,auVar68);
    auVar20 = vpaddd_avx2(auVar20,auVar24);
    auVar33._16_8_ = uStack_70;
    auVar33._0_16_ = auVar98;
    auVar33._24_8_ = uStack_68;
    auVar20 = vpaddd_avx2(auVar20,auVar33);
    auVar33 = vpsrad_avx2(auVar20,ZEXT416((uint)(int)in_DL));
    auVar67._16_8_ = uStack_330;
    auVar67._0_16_ = auVar8;
    auVar67._24_8_ = uStack_328;
    auVar20 = vpmulld_avx2(auVar21,auVar67);
    auVar66._16_8_ = uStack_370;
    auVar66._0_16_ = auVar7;
    auVar66._24_8_ = uStack_368;
    auVar21 = vpmulld_avx2(auVar22,auVar66);
    auVar20 = vpsubd_avx2(auVar21,auVar20);
    auVar34._16_8_ = uStack_70;
    auVar34._0_16_ = auVar98;
    auVar34._24_8_ = uStack_68;
    auVar20 = vpaddd_avx2(auVar20,auVar34);
    auVar34 = vpsrad_avx2(auVar20,ZEXT416((uint)(int)in_DL));
    auVar65._16_8_ = uStack_2f0;
    auVar65._0_16_ = auVar9;
    auVar65._24_8_ = uStack_2e8;
    auVar20 = vpmulld_avx2(auVar39,auVar65);
    auVar64._16_8_ = uStack_2b0;
    auVar64._0_16_ = auVar10;
    auVar64._24_8_ = uStack_2a8;
    auVar21 = vpmulld_avx2(auVar40,auVar64);
    auVar20 = vpaddd_avx2(auVar20,auVar21);
    auVar35._16_8_ = uStack_70;
    auVar35._0_16_ = auVar98;
    auVar35._24_8_ = uStack_68;
    auVar20 = vpaddd_avx2(auVar20,auVar35);
    auVar35 = vpsrad_avx2(auVar20,ZEXT416((uint)(int)in_DL));
    auVar63._16_8_ = uStack_2b0;
    auVar63._0_16_ = auVar10;
    auVar63._24_8_ = uStack_2a8;
    auVar20 = vpmulld_avx2(auVar39,auVar63);
    auVar62._16_8_ = uStack_2f0;
    auVar62._0_16_ = auVar9;
    auVar62._24_8_ = uStack_2e8;
    auVar21 = vpmulld_avx2(auVar40,auVar62);
    auVar20 = vpsubd_avx2(auVar21,auVar20);
    auVar21._16_8_ = uStack_70;
    auVar21._0_16_ = auVar98;
    auVar21._24_8_ = uStack_68;
    auVar20 = vpaddd_avx2(auVar20,auVar21);
    auVar36 = vpsrad_avx2(auVar20,ZEXT416((uint)(int)in_DL));
    auVar20 = vpaddd_avx2(auVar19,auVar25);
    auVar39 = vpsubd_avx2(auVar19,auVar25);
    auVar40 = vpsubd_avx2(auVar37,auVar27);
    auVar19 = vpaddd_avx2(auVar37,auVar27);
    auVar21 = vpaddd_avx2(auVar38,auVar30);
    auVar30 = vpsubd_avx2(auVar38,auVar30);
    auVar27 = vpsubd_avx2(auVar23,auVar26);
    auVar22 = vpaddd_avx2(auVar23,auVar26);
    uStack_35d0 = auVar28._16_8_;
    uStack_35b0 = auVar29._16_8_;
    uStack_3590 = auVar31._16_8_;
    uStack_3570 = auVar32._16_8_;
    uStack_3548 = auVar33._24_8_;
    uStack_3528 = auVar35._24_8_;
    uStack_3508 = auVar36._24_8_;
    uStack_34e8 = auVar34._24_8_;
    auVar61._16_8_ = uStack_270;
    auVar61._0_16_ = auVar11;
    auVar61._24_8_ = uStack_268;
    auVar23 = vpmulld_avx2(auVar20,auVar61);
    auVar60._16_8_ = uStack_230;
    auVar60._0_16_ = auVar12;
    auVar60._24_8_ = uStack_228;
    auVar24 = vpmulld_avx2(auVar22,auVar60);
    auVar23 = vpaddd_avx2(auVar23,auVar24);
    auVar37._16_8_ = uStack_70;
    auVar37._0_16_ = auVar98;
    auVar37._24_8_ = uStack_68;
    auVar23 = vpaddd_avx2(auVar23,auVar37);
    auVar23 = vpsrad_avx2(auVar23,ZEXT416((uint)(int)in_DL));
    auVar59._16_8_ = uStack_230;
    auVar59._0_16_ = auVar12;
    auVar59._24_8_ = uStack_228;
    auVar20 = vpmulld_avx2(auVar20,auVar59);
    auVar58._16_8_ = uStack_270;
    auVar58._0_16_ = auVar11;
    auVar58._24_8_ = uStack_268;
    auVar22 = vpmulld_avx2(auVar22,auVar58);
    auVar20 = vpsubd_avx2(auVar22,auVar20);
    auVar24._16_8_ = uStack_70;
    auVar24._0_16_ = auVar98;
    auVar24._24_8_ = uStack_68;
    auVar20 = vpaddd_avx2(auVar20,auVar24);
    auVar24 = vpsrad_avx2(auVar20,ZEXT416((uint)(int)in_DL));
    auVar57._16_8_ = uStack_1f0;
    auVar57._0_16_ = auVar13;
    auVar57._24_8_ = uStack_1e8;
    auVar20 = vpmulld_avx2(auVar39,auVar57);
    auVar56._16_8_ = uStack_1b0;
    auVar56._0_16_ = auVar14;
    auVar56._24_8_ = uStack_1a8;
    auVar22 = vpmulld_avx2(auVar27,auVar56);
    auVar20 = vpaddd_avx2(auVar20,auVar22);
    auVar25._16_8_ = uStack_70;
    auVar25._0_16_ = auVar98;
    auVar25._24_8_ = uStack_68;
    auVar20 = vpaddd_avx2(auVar20,auVar25);
    auVar25 = vpsrad_avx2(auVar20,ZEXT416((uint)(int)in_DL));
    auVar55._16_8_ = uStack_1b0;
    auVar55._0_16_ = auVar14;
    auVar55._24_8_ = uStack_1a8;
    auVar20 = vpmulld_avx2(auVar39,auVar55);
    auVar54._16_8_ = uStack_1f0;
    auVar54._0_16_ = auVar13;
    auVar54._24_8_ = uStack_1e8;
    auVar22 = vpmulld_avx2(auVar27,auVar54);
    auVar20 = vpsubd_avx2(auVar22,auVar20);
    auVar26._16_8_ = uStack_70;
    auVar26._0_16_ = auVar98;
    auVar26._24_8_ = uStack_68;
    auVar20 = vpaddd_avx2(auVar20,auVar26);
    auVar26 = vpsrad_avx2(auVar20,ZEXT416((uint)(int)in_DL));
    auVar53._16_8_ = uStack_170;
    auVar53._0_16_ = auVar15;
    auVar53._24_8_ = uStack_168;
    auVar20 = vpmulld_avx2(auVar40,auVar53);
    auVar52._16_8_ = uStack_130;
    auVar52._0_16_ = auVar16;
    auVar52._24_8_ = uStack_128;
    auVar22 = vpmulld_avx2(auVar30,auVar52);
    auVar20 = vpaddd_avx2(auVar20,auVar22);
    auVar27._16_8_ = uStack_70;
    auVar27._0_16_ = auVar98;
    auVar27._24_8_ = uStack_68;
    auVar20 = vpaddd_avx2(auVar20,auVar27);
    auVar27 = vpsrad_avx2(auVar20,ZEXT416((uint)(int)in_DL));
    auVar51._16_8_ = uStack_130;
    auVar51._0_16_ = auVar16;
    auVar51._24_8_ = uStack_128;
    auVar20 = vpmulld_avx2(auVar40,auVar51);
    auVar50._16_8_ = uStack_170;
    auVar50._0_16_ = auVar15;
    auVar50._24_8_ = uStack_168;
    auVar22 = vpmulld_avx2(auVar30,auVar50);
    auVar20 = vpsubd_avx2(auVar22,auVar20);
    auVar30._16_8_ = uStack_70;
    auVar30._0_16_ = auVar98;
    auVar30._24_8_ = uStack_68;
    auVar20 = vpaddd_avx2(auVar20,auVar30);
    auVar30 = vpsrad_avx2(auVar20,ZEXT416((uint)(int)in_DL));
    auVar49._16_8_ = uStack_f0;
    auVar49._0_16_ = auVar17;
    auVar49._24_8_ = uStack_e8;
    auVar20 = vpmulld_avx2(auVar19,auVar49);
    auVar48._16_8_ = uStack_b0;
    auVar48._0_16_ = auVar18;
    auVar48._24_8_ = uStack_a8;
    auVar22 = vpmulld_avx2(auVar21,auVar48);
    auVar20 = vpaddd_avx2(auVar20,auVar22);
    auVar22._16_8_ = uStack_70;
    auVar22._0_16_ = auVar98;
    auVar22._24_8_ = uStack_68;
    auVar20 = vpaddd_avx2(auVar20,auVar22);
    auVar22 = vpsrad_avx2(auVar20,ZEXT416((uint)(int)in_DL));
    auVar47._16_8_ = uStack_b0;
    auVar47._0_16_ = auVar18;
    auVar47._24_8_ = uStack_a8;
    auVar19 = vpmulld_avx2(auVar19,auVar47);
    auVar39._16_8_ = uStack_f0;
    auVar39._0_16_ = auVar17;
    auVar39._24_8_ = uStack_e8;
    auVar20 = vpmulld_avx2(auVar21,auVar39);
    auVar19 = vpsubd_avx2(auVar20,auVar19);
    auVar20._16_8_ = uStack_70;
    auVar20._0_16_ = auVar98;
    auVar20._24_8_ = uStack_68;
    auVar19 = vpaddd_avx2(auVar19,auVar20);
    auVar19 = vpsrad_avx2(auVar19,ZEXT416((uint)(int)in_DL));
    local_37e0 = auVar28._0_8_;
    uStack_37d8 = auVar28._8_8_;
    puVar97 = (undefined8 *)(in_RSI + (long)local_3804 * 0x20);
    *puVar97 = local_37e0;
    puVar97[1] = uStack_37d8;
    puVar97[2] = uStack_35d0;
    puVar97[3] = uStack_37c8;
    local_36e0 = auVar23._0_8_;
    uStack_36d8 = auVar23._8_8_;
    uStack_36d0 = auVar23._16_8_;
    uStack_36c8 = auVar23._24_8_;
    puVar97 = (undefined8 *)(in_RSI + (long)(in_R8D + local_3804) * 0x20);
    *puVar97 = local_36e0;
    puVar97[1] = uStack_36d8;
    puVar97[2] = uStack_36d0;
    puVar97[3] = uStack_36c8;
    local_3760 = auVar33._0_8_;
    uStack_3758 = auVar33._8_8_;
    uStack_3750 = auVar33._16_8_;
    puVar97 = (undefined8 *)(in_RSI + (long)(in_R8D * 2 + local_3804) * 0x20);
    *puVar97 = local_3760;
    puVar97[1] = uStack_3758;
    puVar97[2] = uStack_3750;
    puVar97[3] = uStack_3548;
    local_3660 = auVar19._0_8_;
    uStack_3658 = auVar19._8_8_;
    uStack_3650 = auVar19._16_8_;
    uStack_3648 = auVar19._24_8_;
    puVar97 = (undefined8 *)(in_RSI + (long)(in_R8D * 3 + local_3804) * 0x20);
    *puVar97 = local_3660;
    puVar97[1] = uStack_3658;
    puVar97[2] = uStack_3650;
    puVar97[3] = uStack_3648;
    local_37a0 = auVar31._0_8_;
    uStack_3798 = auVar31._8_8_;
    puVar97 = (undefined8 *)(in_RSI + (long)(in_R8D * 4 + local_3804) * 0x20);
    *puVar97 = local_37a0;
    puVar97[1] = uStack_3798;
    puVar97[2] = uStack_3590;
    puVar97[3] = uStack_3788;
    local_36a0 = auVar27._0_8_;
    uStack_3698 = auVar27._8_8_;
    uStack_3690 = auVar27._16_8_;
    uStack_3688 = auVar27._24_8_;
    puVar97 = (undefined8 *)(in_RSI + (long)(in_R8D * 5 + local_3804) * 0x20);
    *puVar97 = local_36a0;
    puVar97[1] = uStack_3698;
    puVar97[2] = uStack_3690;
    puVar97[3] = uStack_3688;
    local_3720 = auVar36._0_8_;
    uStack_3718 = auVar36._8_8_;
    uStack_3710 = auVar36._16_8_;
    puVar97 = (undefined8 *)(in_RSI + (long)(in_R8D * 6 + local_3804) * 0x20);
    *puVar97 = local_3720;
    puVar97[1] = uStack_3718;
    puVar97[2] = uStack_3710;
    puVar97[3] = uStack_3508;
    local_3620 = auVar26._0_8_;
    uStack_3618 = auVar26._8_8_;
    uStack_3610 = auVar26._16_8_;
    uStack_3608 = auVar26._24_8_;
    puVar97 = (undefined8 *)(in_RSI + (long)(in_R8D * 7 + local_3804) * 0x20);
    *puVar97 = local_3620;
    puVar97[1] = uStack_3618;
    puVar97[2] = uStack_3610;
    puVar97[3] = uStack_3608;
    local_37c0 = auVar29._0_8_;
    uStack_37b8 = auVar29._8_8_;
    puVar97 = (undefined8 *)(in_RSI + (long)(in_R8D * 8 + local_3804) * 0x20);
    *puVar97 = local_37c0;
    puVar97[1] = uStack_37b8;
    puVar97[2] = uStack_35b0;
    puVar97[3] = uStack_37a8;
    local_36c0 = auVar25._0_8_;
    uStack_36b8 = auVar25._8_8_;
    uStack_36b0 = auVar25._16_8_;
    uStack_36a8 = auVar25._24_8_;
    puVar97 = (undefined8 *)(in_RSI + (long)(in_R8D * 9 + local_3804) * 0x20);
    *puVar97 = local_36c0;
    puVar97[1] = uStack_36b8;
    puVar97[2] = uStack_36b0;
    puVar97[3] = uStack_36a8;
    local_3740 = auVar35._0_8_;
    uStack_3738 = auVar35._8_8_;
    uStack_3730 = auVar35._16_8_;
    puVar97 = (undefined8 *)(in_RSI + (long)(in_R8D * 10 + local_3804) * 0x20);
    *puVar97 = local_3740;
    puVar97[1] = uStack_3738;
    puVar97[2] = uStack_3730;
    puVar97[3] = uStack_3528;
    local_3640 = auVar30._0_8_;
    uStack_3638 = auVar30._8_8_;
    uStack_3630 = auVar30._16_8_;
    uStack_3628 = auVar30._24_8_;
    puVar97 = (undefined8 *)(in_RSI + (long)(in_R8D * 0xb + local_3804) * 0x20);
    *puVar97 = local_3640;
    puVar97[1] = uStack_3638;
    puVar97[2] = uStack_3630;
    puVar97[3] = uStack_3628;
    local_3780 = auVar32._0_8_;
    uStack_3778 = auVar32._8_8_;
    puVar97 = (undefined8 *)(in_RSI + (long)(in_R8D * 0xc + local_3804) * 0x20);
    *puVar97 = local_3780;
    puVar97[1] = uStack_3778;
    puVar97[2] = uStack_3570;
    puVar97[3] = uStack_3768;
    local_3680 = auVar22._0_8_;
    uStack_3678 = auVar22._8_8_;
    uStack_3670 = auVar22._16_8_;
    uStack_3668 = auVar22._24_8_;
    puVar97 = (undefined8 *)(in_RSI + (long)(in_R8D * 0xd + local_3804) * 0x20);
    *puVar97 = local_3680;
    puVar97[1] = uStack_3678;
    puVar97[2] = uStack_3670;
    puVar97[3] = uStack_3668;
    local_3700 = auVar34._0_8_;
    uStack_36f8 = auVar34._8_8_;
    uStack_36f0 = auVar34._16_8_;
    puVar97 = (undefined8 *)(in_RSI + (long)(in_R8D * 0xe + local_3804) * 0x20);
    *puVar97 = local_3700;
    puVar97[1] = uStack_36f8;
    puVar97[2] = uStack_36f0;
    puVar97[3] = uStack_34e8;
    local_3600 = auVar24._0_8_;
    uStack_35f8 = auVar24._8_8_;
    uStack_35f0 = auVar24._16_8_;
    uStack_35e8 = auVar24._24_8_;
    puVar97 = (undefined8 *)(in_RSI + (long)(in_R8D * 0xf + local_3804) * 0x20);
    *puVar97 = local_3600;
    puVar97[1] = uStack_35f8;
    puVar97[2] = uStack_35f0;
    puVar97[3] = uStack_35e8;
  }
  return;
}

Assistant:

static void fdct16_avx2(__m256i *in, __m256i *out, const int8_t bit,
                        const int col_num, const int outstride) {
  const int32_t *cospi = cospi_arr(bit);
  const __m256i cospi32 = _mm256_set1_epi32(cospi[32]);
  const __m256i cospim32 = _mm256_set1_epi32(-cospi[32]);
  const __m256i cospi48 = _mm256_set1_epi32(cospi[48]);
  const __m256i cospi16 = _mm256_set1_epi32(cospi[16]);
  const __m256i cospim48 = _mm256_set1_epi32(-cospi[48]);
  const __m256i cospim16 = _mm256_set1_epi32(-cospi[16]);
  const __m256i cospi56 = _mm256_set1_epi32(cospi[56]);
  const __m256i cospi8 = _mm256_set1_epi32(cospi[8]);
  const __m256i cospi24 = _mm256_set1_epi32(cospi[24]);
  const __m256i cospi40 = _mm256_set1_epi32(cospi[40]);
  const __m256i cospi60 = _mm256_set1_epi32(cospi[60]);
  const __m256i cospi4 = _mm256_set1_epi32(cospi[4]);
  const __m256i cospi28 = _mm256_set1_epi32(cospi[28]);
  const __m256i cospi36 = _mm256_set1_epi32(cospi[36]);
  const __m256i cospi44 = _mm256_set1_epi32(cospi[44]);
  const __m256i cospi20 = _mm256_set1_epi32(cospi[20]);
  const __m256i cospi12 = _mm256_set1_epi32(cospi[12]);
  const __m256i cospi52 = _mm256_set1_epi32(cospi[52]);
  const __m256i rnding = _mm256_set1_epi32(1 << (bit - 1));
  __m256i u[16], v[16], x;
  int col;

  // Calculate the column 0, 1, 2, 3
  for (col = 0; col < col_num; ++col) {
    // stage 0
    // stage 1
    u[0] = _mm256_add_epi32(in[0 * col_num + col], in[15 * col_num + col]);
    u[15] = _mm256_sub_epi32(in[0 * col_num + col], in[15 * col_num + col]);
    u[1] = _mm256_add_epi32(in[1 * col_num + col], in[14 * col_num + col]);
    u[14] = _mm256_sub_epi32(in[1 * col_num + col], in[14 * col_num + col]);
    u[2] = _mm256_add_epi32(in[2 * col_num + col], in[13 * col_num + col]);
    u[13] = _mm256_sub_epi32(in[2 * col_num + col], in[13 * col_num + col]);
    u[3] = _mm256_add_epi32(in[3 * col_num + col], in[12 * col_num + col]);
    u[12] = _mm256_sub_epi32(in[3 * col_num + col], in[12 * col_num + col]);
    u[4] = _mm256_add_epi32(in[4 * col_num + col], in[11 * col_num + col]);
    u[11] = _mm256_sub_epi32(in[4 * col_num + col], in[11 * col_num + col]);
    u[5] = _mm256_add_epi32(in[5 * col_num + col], in[10 * col_num + col]);
    u[10] = _mm256_sub_epi32(in[5 * col_num + col], in[10 * col_num + col]);
    u[6] = _mm256_add_epi32(in[6 * col_num + col], in[9 * col_num + col]);
    u[9] = _mm256_sub_epi32(in[6 * col_num + col], in[9 * col_num + col]);
    u[7] = _mm256_add_epi32(in[7 * col_num + col], in[8 * col_num + col]);
    u[8] = _mm256_sub_epi32(in[7 * col_num + col], in[8 * col_num + col]);

    // stage 2
    v[0] = _mm256_add_epi32(u[0], u[7]);
    v[7] = _mm256_sub_epi32(u[0], u[7]);
    v[1] = _mm256_add_epi32(u[1], u[6]);
    v[6] = _mm256_sub_epi32(u[1], u[6]);
    v[2] = _mm256_add_epi32(u[2], u[5]);
    v[5] = _mm256_sub_epi32(u[2], u[5]);
    v[3] = _mm256_add_epi32(u[3], u[4]);
    v[4] = _mm256_sub_epi32(u[3], u[4]);
    v[8] = u[8];
    v[9] = u[9];

    v[10] = _mm256_mullo_epi32(u[10], cospim32);
    x = _mm256_mullo_epi32(u[13], cospi32);
    v[10] = _mm256_add_epi32(v[10], x);
    v[10] = _mm256_add_epi32(v[10], rnding);
    v[10] = _mm256_srai_epi32(v[10], bit);

    v[13] = _mm256_mullo_epi32(u[10], cospi32);
    x = _mm256_mullo_epi32(u[13], cospim32);
    v[13] = _mm256_sub_epi32(v[13], x);
    v[13] = _mm256_add_epi32(v[13], rnding);
    v[13] = _mm256_srai_epi32(v[13], bit);

    v[11] = _mm256_mullo_epi32(u[11], cospim32);
    x = _mm256_mullo_epi32(u[12], cospi32);
    v[11] = _mm256_add_epi32(v[11], x);
    v[11] = _mm256_add_epi32(v[11], rnding);
    v[11] = _mm256_srai_epi32(v[11], bit);

    v[12] = _mm256_mullo_epi32(u[11], cospi32);
    x = _mm256_mullo_epi32(u[12], cospim32);
    v[12] = _mm256_sub_epi32(v[12], x);
    v[12] = _mm256_add_epi32(v[12], rnding);
    v[12] = _mm256_srai_epi32(v[12], bit);
    v[14] = u[14];
    v[15] = u[15];

    // stage 3
    u[0] = _mm256_add_epi32(v[0], v[3]);
    u[3] = _mm256_sub_epi32(v[0], v[3]);
    u[1] = _mm256_add_epi32(v[1], v[2]);
    u[2] = _mm256_sub_epi32(v[1], v[2]);
    u[4] = v[4];

    u[5] = _mm256_mullo_epi32(v[5], cospim32);
    x = _mm256_mullo_epi32(v[6], cospi32);
    u[5] = _mm256_add_epi32(u[5], x);
    u[5] = _mm256_add_epi32(u[5], rnding);
    u[5] = _mm256_srai_epi32(u[5], bit);

    u[6] = _mm256_mullo_epi32(v[5], cospi32);
    x = _mm256_mullo_epi32(v[6], cospim32);
    u[6] = _mm256_sub_epi32(u[6], x);
    u[6] = _mm256_add_epi32(u[6], rnding);
    u[6] = _mm256_srai_epi32(u[6], bit);

    u[7] = v[7];
    u[8] = _mm256_add_epi32(v[8], v[11]);
    u[11] = _mm256_sub_epi32(v[8], v[11]);
    u[9] = _mm256_add_epi32(v[9], v[10]);
    u[10] = _mm256_sub_epi32(v[9], v[10]);
    u[12] = _mm256_sub_epi32(v[15], v[12]);
    u[15] = _mm256_add_epi32(v[15], v[12]);
    u[13] = _mm256_sub_epi32(v[14], v[13]);
    u[14] = _mm256_add_epi32(v[14], v[13]);

    // stage 4
    u[0] = _mm256_mullo_epi32(u[0], cospi32);
    u[1] = _mm256_mullo_epi32(u[1], cospi32);
    v[0] = _mm256_add_epi32(u[0], u[1]);
    v[0] = _mm256_add_epi32(v[0], rnding);
    v[0] = _mm256_srai_epi32(v[0], bit);

    v[1] = _mm256_sub_epi32(u[0], u[1]);
    v[1] = _mm256_add_epi32(v[1], rnding);
    v[1] = _mm256_srai_epi32(v[1], bit);

    v[2] = _mm256_mullo_epi32(u[2], cospi48);
    x = _mm256_mullo_epi32(u[3], cospi16);
    v[2] = _mm256_add_epi32(v[2], x);
    v[2] = _mm256_add_epi32(v[2], rnding);
    v[2] = _mm256_srai_epi32(v[2], bit);

    v[3] = _mm256_mullo_epi32(u[2], cospi16);
    x = _mm256_mullo_epi32(u[3], cospi48);
    v[3] = _mm256_sub_epi32(x, v[3]);
    v[3] = _mm256_add_epi32(v[3], rnding);
    v[3] = _mm256_srai_epi32(v[3], bit);

    v[4] = _mm256_add_epi32(u[4], u[5]);
    v[5] = _mm256_sub_epi32(u[4], u[5]);
    v[6] = _mm256_sub_epi32(u[7], u[6]);
    v[7] = _mm256_add_epi32(u[7], u[6]);
    v[8] = u[8];

    v[9] = _mm256_mullo_epi32(u[9], cospim16);
    x = _mm256_mullo_epi32(u[14], cospi48);
    v[9] = _mm256_add_epi32(v[9], x);
    v[9] = _mm256_add_epi32(v[9], rnding);
    v[9] = _mm256_srai_epi32(v[9], bit);

    v[14] = _mm256_mullo_epi32(u[9], cospi48);
    x = _mm256_mullo_epi32(u[14], cospim16);
    v[14] = _mm256_sub_epi32(v[14], x);
    v[14] = _mm256_add_epi32(v[14], rnding);
    v[14] = _mm256_srai_epi32(v[14], bit);

    v[10] = _mm256_mullo_epi32(u[10], cospim48);
    x = _mm256_mullo_epi32(u[13], cospim16);
    v[10] = _mm256_add_epi32(v[10], x);
    v[10] = _mm256_add_epi32(v[10], rnding);
    v[10] = _mm256_srai_epi32(v[10], bit);

    v[13] = _mm256_mullo_epi32(u[10], cospim16);
    x = _mm256_mullo_epi32(u[13], cospim48);
    v[13] = _mm256_sub_epi32(v[13], x);
    v[13] = _mm256_add_epi32(v[13], rnding);
    v[13] = _mm256_srai_epi32(v[13], bit);

    v[11] = u[11];
    v[12] = u[12];
    v[15] = u[15];

    // stage 5
    u[0] = v[0];
    u[1] = v[1];
    u[2] = v[2];
    u[3] = v[3];

    u[4] = _mm256_mullo_epi32(v[4], cospi56);
    x = _mm256_mullo_epi32(v[7], cospi8);
    u[4] = _mm256_add_epi32(u[4], x);
    u[4] = _mm256_add_epi32(u[4], rnding);
    u[4] = _mm256_srai_epi32(u[4], bit);

    u[7] = _mm256_mullo_epi32(v[4], cospi8);
    x = _mm256_mullo_epi32(v[7], cospi56);
    u[7] = _mm256_sub_epi32(x, u[7]);
    u[7] = _mm256_add_epi32(u[7], rnding);
    u[7] = _mm256_srai_epi32(u[7], bit);

    u[5] = _mm256_mullo_epi32(v[5], cospi24);
    x = _mm256_mullo_epi32(v[6], cospi40);
    u[5] = _mm256_add_epi32(u[5], x);
    u[5] = _mm256_add_epi32(u[5], rnding);
    u[5] = _mm256_srai_epi32(u[5], bit);

    u[6] = _mm256_mullo_epi32(v[5], cospi40);
    x = _mm256_mullo_epi32(v[6], cospi24);
    u[6] = _mm256_sub_epi32(x, u[6]);
    u[6] = _mm256_add_epi32(u[6], rnding);
    u[6] = _mm256_srai_epi32(u[6], bit);

    u[8] = _mm256_add_epi32(v[8], v[9]);
    u[9] = _mm256_sub_epi32(v[8], v[9]);
    u[10] = _mm256_sub_epi32(v[11], v[10]);
    u[11] = _mm256_add_epi32(v[11], v[10]);
    u[12] = _mm256_add_epi32(v[12], v[13]);
    u[13] = _mm256_sub_epi32(v[12], v[13]);
    u[14] = _mm256_sub_epi32(v[15], v[14]);
    u[15] = _mm256_add_epi32(v[15], v[14]);

    // stage 6
    v[0] = u[0];
    v[1] = u[1];
    v[2] = u[2];
    v[3] = u[3];
    v[4] = u[4];
    v[5] = u[5];
    v[6] = u[6];
    v[7] = u[7];

    v[8] = _mm256_mullo_epi32(u[8], cospi60);
    x = _mm256_mullo_epi32(u[15], cospi4);
    v[8] = _mm256_add_epi32(v[8], x);
    v[8] = _mm256_add_epi32(v[8], rnding);
    v[8] = _mm256_srai_epi32(v[8], bit);

    v[15] = _mm256_mullo_epi32(u[8], cospi4);
    x = _mm256_mullo_epi32(u[15], cospi60);
    v[15] = _mm256_sub_epi32(x, v[15]);
    v[15] = _mm256_add_epi32(v[15], rnding);
    v[15] = _mm256_srai_epi32(v[15], bit);

    v[9] = _mm256_mullo_epi32(u[9], cospi28);
    x = _mm256_mullo_epi32(u[14], cospi36);
    v[9] = _mm256_add_epi32(v[9], x);
    v[9] = _mm256_add_epi32(v[9], rnding);
    v[9] = _mm256_srai_epi32(v[9], bit);

    v[14] = _mm256_mullo_epi32(u[9], cospi36);
    x = _mm256_mullo_epi32(u[14], cospi28);
    v[14] = _mm256_sub_epi32(x, v[14]);
    v[14] = _mm256_add_epi32(v[14], rnding);
    v[14] = _mm256_srai_epi32(v[14], bit);

    v[10] = _mm256_mullo_epi32(u[10], cospi44);
    x = _mm256_mullo_epi32(u[13], cospi20);
    v[10] = _mm256_add_epi32(v[10], x);
    v[10] = _mm256_add_epi32(v[10], rnding);
    v[10] = _mm256_srai_epi32(v[10], bit);

    v[13] = _mm256_mullo_epi32(u[10], cospi20);
    x = _mm256_mullo_epi32(u[13], cospi44);
    v[13] = _mm256_sub_epi32(x, v[13]);
    v[13] = _mm256_add_epi32(v[13], rnding);
    v[13] = _mm256_srai_epi32(v[13], bit);

    v[11] = _mm256_mullo_epi32(u[11], cospi12);
    x = _mm256_mullo_epi32(u[12], cospi52);
    v[11] = _mm256_add_epi32(v[11], x);
    v[11] = _mm256_add_epi32(v[11], rnding);
    v[11] = _mm256_srai_epi32(v[11], bit);

    v[12] = _mm256_mullo_epi32(u[11], cospi52);
    x = _mm256_mullo_epi32(u[12], cospi12);
    v[12] = _mm256_sub_epi32(x, v[12]);
    v[12] = _mm256_add_epi32(v[12], rnding);
    v[12] = _mm256_srai_epi32(v[12], bit);

    out[0 * outstride + col] = v[0];
    out[1 * outstride + col] = v[8];
    out[2 * outstride + col] = v[4];
    out[3 * outstride + col] = v[12];
    out[4 * outstride + col] = v[2];
    out[5 * outstride + col] = v[10];
    out[6 * outstride + col] = v[6];
    out[7 * outstride + col] = v[14];
    out[8 * outstride + col] = v[1];
    out[9 * outstride + col] = v[9];
    out[10 * outstride + col] = v[5];
    out[11 * outstride + col] = v[13];
    out[12 * outstride + col] = v[3];
    out[13 * outstride + col] = v[11];
    out[14 * outstride + col] = v[7];
    out[15 * outstride + col] = v[15];
  }
}